

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1L1Q1P<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    *__return_storage_ptr__,
                   vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                   *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                           *plPair,
                   vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                   *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                          *lCPair)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  SrcEvaluatorType srcEvaluator_2;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pCVar5;
  ostream *poVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Scalar local_54c;
  float local_548;
  undefined4 uStack_544;
  float fStack_540;
  undefined4 uStack_53c;
  float local_538 [2];
  float afStack_530 [2];
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *local_528;
  float local_51c;
  Scalar local_518;
  Scalar local_514;
  Scalar local_510;
  Scalar local_50c;
  Scalar local_508;
  Scalar local_504;
  Scalar local_500;
  Scalar local_4fc;
  Scalar local_4f8;
  Scalar local_4f4;
  Scalar local_4f0;
  float local_4ec;
  float local_4e8 [2];
  float afStack_4e0 [2];
  undefined1 local_4d8 [24];
  Matrix<float,_3,_1,_0,_3,_1> tQ2;
  Matrix<float,_3,_1,_0,_3,_1> tQ1;
  Matrix<float,_3,_1,_0,_3,_1> tP2;
  Matrix<float,_3,_1,_0,_3,_1> tP1;
  Matrix<float,_6,_1,_0,_6,_1> L2_2;
  undefined1 local_460 [16];
  Matrix<float,_4,_4,_0,_4,_4> *local_450;
  _Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_438;
  Matrix<float,_6,_1,_0,_6,_1> L1_2;
  Matrix<float,_4,_1,_0,_4,_1> R2_B;
  Matrix<float,_4,_1,_0,_4,_1> R1_B;
  Matrix<float,_4,_1,_0,_4,_1> Q2;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  local_3b8;
  Matrix<float,_6,_6,_0,_6,_6> transLineU;
  Matrix<float,_4,_4,_0,_4,_4> TF2;
  Matrix<float,_4,_4,_0,_4,_4> TF1;
  Matrix<float,_3,_1,_0,_3,_1> local_248;
  Matrix<float,_3,_1,_0,_3,_1> local_23c;
  Matrix<float,_6,_1,_0,_6,_1> L2;
  Matrix<float,_3,_1,_0,_3,_1> D2;
  Matrix<float,_6,_1,_0,_6,_1> L1;
  Matrix<float,_3,_1,_0,_3,_1> D1;
  undefined1 local_1e8 [16];
  variable_if_dynamic<long,__1> local_1d8;
  XprTypeNested local_1d0;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_4,_4,_0,_4,_4> TV;
  Matrix<float,_6,_6,_0,_6,_6> transLineV;
  Matrix<float,_4,_1,_0,_4,_1> Q1;
  Matrix<float,_4,_1,_0,_4,_1> local_78;
  Matrix<float,_4,_1,_0,_4,_1> local_68;
  Matrix<float,_4,_1,_0,_4,_1> local_58;
  Matrix<float,_4,_1,_0,_4,_1> local_48;
  
  pauVar1 = *(undefined1 (**) [16])ptPair;
  if (((*(undefined1 (**) [16])(ptPair + 8) != pauVar1) &&
      (pfVar2 = *(float **)lPair, *(float **)(lPair + 8) != pfVar2)) &&
     (pfVar3 = *(float **)plPair, *(float **)(plPair + 8) != pfVar3)) {
    local_4d8._0_16_ = *pauVar1;
    _local_548 = *(undefined8 *)pauVar1[1];
    _fStack_540 = *(undefined8 *)(pauVar1[1] + 8);
    local_538 = *(float (*) [2])pfVar3;
    afStack_530 = *(float (*) [2])(pfVar3 + 2);
    local_4e8 = *(float (*) [2])(pfVar3 + 4);
    afStack_4e0 = *(float (*) [2])(pfVar3 + 6);
    Q1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)pfVar2;
    Q1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 2);
    Q2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 4);
    Q2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 6);
    R1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 8);
    R1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 10);
    R2_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0xc);
    R2_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0xe);
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_528 = (vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                 *)__return_storage_ptr__;
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q1,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
               + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP1,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                     *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q2,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
               + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP2,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                     *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&R1_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               R1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ1,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                     *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&R2_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               R2_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ2,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                     *)&transLineU);
    transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array.
    _0_8_ = &tP2;
    transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array.
    _8_8_ = &tP1;
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&D1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D1);
    transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
         = tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           * tP2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1] - tP2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2] *
                   tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
         = tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           * tP2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2] - tP2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0] *
                   tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
         = tP2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           * tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1] - tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0] *
                   tP2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<float,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L1,3);
    transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
         = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L1,(Scalar *)&transLineV);
    transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array.
    _0_8_ = &tQ2;
    transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array.
    _8_8_ = &tQ1;
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&D2,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D2);
    transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
         = tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           * tQ2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1] - tQ2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2] *
                   tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
         = tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           * tQ2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2] - tQ2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0] *
                   tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
         = tQ2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           * tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1] - tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0] *
                   tQ2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<float,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L2,3);
    transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
         = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L2,(Scalar *)&transLineV);
    auVar4 = local_4d8._0_16_;
    local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (float)local_4d8._0_4_;
    local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         (float)local_4d8._4_4_;
    local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
         (float)local_4d8._8_4_;
    local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         (float)local_4d8._12_4_;
    local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         local_548;
    local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         uStack_544;
    local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
         fStack_540;
    local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         uStack_53c;
    local_68.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         local_538[0];
    local_68.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         local_538[1];
    local_68.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
         afStack_530[0];
    local_68.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         afStack_530[1];
    local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         local_4e8[0];
    local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         local_4e8[1];
    local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
         afStack_4e0[0];
    local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         afStack_4e0[1];
    local_4d8._0_16_ = auVar4;
    getPredefinedTransformations1L1Q1P<float>
              ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&local_438,&local_48,&local_58,&local_68,&local_78);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)
          local_438._M_impl.super__Vector_impl_data._M_finish[-1].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._16_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._24_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._32_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._40_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._48_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc)
    ;
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe)
    ;
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)
          local_438._M_impl.super__Vector_impl_data._M_finish[-2].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._16_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._24_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._32_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._40_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._48_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc)
    ;
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
         *(undefined8 *)
          (local_438._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe)
    ;
    local_438._M_impl.super__Vector_impl_data._M_finish =
         local_438._M_impl.super__Vector_impl_data._M_finish + -2;
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TF1,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TF2,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TF2,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TF1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TF1,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&TF2,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TF2,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TF1);
    local_54c = -NAN;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)&L2_2,
                    &TU,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&TF1,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)&L2_2,3)
    ;
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_23c,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&TF1);
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_460,&local_23c);
    Eigen::operator*(&local_3b8,(int *)&local_54c,(StorageBaseType *)local_460);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)local_1e8,&TU,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&TF2,&local_3b8,(Rhs *)local_1e8);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&L1_2,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&L1_2,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&TF2);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TF1,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TF2,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TF2,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TF1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TF1,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&TF2,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TF2,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TF1);
    local_54c = -NAN;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)&L2_2,
                    &TV,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&TF1,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)&L2_2,3)
    ;
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_248,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&TF1);
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_460,&local_248);
    Eigen::operator*(&local_3b8,(int *)&local_54c,(StorageBaseType *)local_460);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)local_1e8,&TV,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&TF2,&local_3b8,(Rhs *)local_1e8);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&L1_2,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&L1_2,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&TF2);
    TF1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &transLineU;
    TF1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&L1_2,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                      *)&TF1);
    TF1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         &transLineV;
    TF1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L2;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&L2_2,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                      *)&TF1);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&TF1,4,4);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&TF2,4,4);
    fVar10 = ((((L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2] *
                 L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[5] -
                L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] *
                L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0]) -
               L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1] *
               L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4]) -
              L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] *
              L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1]) -
             L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[3]) +
             L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [5] * L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[2];
    fVar8 = L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            [4] * -2.0 *
            L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            [0] + (L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[3] +
                  L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3]) *
                  L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                  (L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[0] +
                  L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0]) *
                  L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] +
                  L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * -2.0 *
                  L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3];
    uStack_544 = -0.0;
    fStack_540 = -0.0;
    uStack_53c = -0.0;
    local_548 = -fVar8;
    fVar9 = fVar8 * fVar8 +
            fVar10 * -4.0 *
            (L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[3] +
             L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1] * L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[4] +
             L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2] * L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[5] +
             L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3] * L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[0] +
             L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [4] * L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array[1] +
            L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            [5] * L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2]);
    fVar7 = SQRT(fVar9);
    local_538[0] = fVar10;
    local_4e8[0] = fVar7;
    if (fVar9 < 0.0) {
      uStack_544 = -0.0;
      fStack_540 = -0.0;
      uStack_53c = -0.0;
      local_4d8._0_16_ = ZEXT416((uint)fVar9);
      fVar7 = sqrtf(fVar9);
      fVar9 = (float)local_4d8._0_4_;
    }
    local_538[0] = local_538[0] + local_538[0];
    local_548 = (local_548 - fVar7) / local_538[0];
    if (fVar9 < 0.0) {
      local_4e8[0] = sqrtf(fVar9);
    }
    if (!NAN(local_548)) {
      local_51c = local_548 * local_548 + 1.0;
      fVar9 = (1.0 - local_548 * local_548) / local_51c;
      local_4d8._0_4_ = fVar9;
      local_1e8._8_8_ = 0;
      local_1d8.m_value = 1;
      local_1d0 = (XprTypeNested)0x1;
      TF1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
           fVar9;
      local_460._0_4_ = (local_548 * -2.0) / local_51c;
      local_1e8._0_8_ = (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&TF1;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1e8,
                          (Scalar *)local_460);
      local_3b8._0_4_ = 0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,(Scalar *)&local_3b8);
      local_54c = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_54c);
      local_4ec = (local_548 + local_548) / local_51c;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4ec);
      local_4f0 = (Scalar)local_4d8._0_4_;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4f0);
      local_4f4 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4f4);
      local_4f8 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4f8);
      local_4fc = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4fc);
      local_500 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_500);
      local_504 = 1.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_504);
      local_508 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_508);
      local_50c = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_50c);
      local_510 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_510);
      local_514 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_514);
      local_518 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar5,&local_518);
      Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::finished
                ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1e8);
      local_450 = &TU;
      local_460._0_8_ = &TV;
      local_460._8_8_ = (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&TF1;
      Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
      _set_noalias<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_1e8,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                  *)local_460);
      std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
      emplace_back<Eigen::Matrix<float,4,4,0,4,4>>
                (local_528,(Matrix<float,_4,_4,_0,_4,_4> *)local_1e8);
      local_4e8[0] = (local_4e8[0] - fVar8) / local_538[0];
      local_548 = local_4e8[0] * local_4e8[0] + 1.0;
      TF2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
           (1.0 - local_4e8[0] * local_4e8[0]) / local_548;
      local_1e8._8_8_ = 0;
      local_1d8.m_value = 1;
      local_1d0 = (XprTypeNested)0x1;
      local_460._0_4_ = (local_4e8[0] * -2.0) / local_548;
      local_1e8._0_8_ = &TF2;
      local_538[0] = TF2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0];
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1e8,
                          (Scalar *)local_460);
      local_3b8._0_4_ = 0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,(Scalar *)&local_3b8);
      local_54c = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_54c);
      local_4ec = (local_4e8[0] + local_4e8[0]) / local_548;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4ec);
      local_4f0 = local_538[0];
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4f0);
      local_4f4 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4f4);
      local_4f8 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4f8);
      local_4fc = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_4fc);
      local_500 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_500);
      local_504 = 1.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_504);
      local_508 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_508);
      local_50c = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_50c);
      local_510 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_510);
      local_514 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar5,&local_514);
      local_518 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar5,&local_518);
      Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::finished
                ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1e8);
      __return_storage_ptr__ =
           (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            *)local_528;
      local_450 = &TU;
      local_460._0_8_ = &TV;
      local_460._8_8_ = &TF2;
      Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
      _set_noalias<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_1e8,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                  *)local_460);
      std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
      emplace_back<Eigen::Matrix<float,4,4,0,4,4>>
                ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                  *)__return_storage_ptr__,(Matrix<float,_4,_4,_0,_4,_4> *)local_1e8);
    }
    std::
    _Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::~_Vector_base(&local_438);
    return (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            *)(vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,
                           "Solver 1L1Q1P requires at least 1 point, 1 plane, and 1 line pair!");
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(-1);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1L1Q1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 1 || lPair.size() < 1 || plPair.size() < 1){
		std::cerr << "Solver 1L1Q1P requires at least 1 point, 1 plane, and 1 line pair!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec,4,1> P1,P1_B,Pi,Pi_B,Q1,Q2,R1_B,R2_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;
	Pi = plPair[0].first; Pi_B = plPair[0].second;

	Q1 = lPair[0].first.first; Q2 = lPair[0].first.second;
	R1_B = lPair[0].second.first; R2_B = lPair[0].second.second;

	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP1, tP2, tQ1, tQ2;
	tP1 = Q1.head(3) / Q1(3);
	tP2 = Q2.head(3) / Q2(3);
	tQ1 = R1_B.head(3) / R1_B(3);
	tQ2 = R2_B.head(3) / R2_B(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3,1> D1 = tP2 - tP1;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP2.cross(tP1);
	L1 /= L1.head(3).norm();
	// starting from line 2
	Matrix<floatPrec, 3,1> D2 = tQ2 - tQ1;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tQ2.cross(tQ1);
	L2 /= L2.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations1L1Q1P<floatPrec>(P1, P1_B, Pi, Pi_B);

	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_2, L2_2;
	L1_2 = transLineU * L1;
	L2_2 = transLineV * L2;

	// compute rotation around Z axis
	// initialize two transformation solutions
	Matrix<floatPrec, 4,4> TF1, TF2;
	TF1.setIdentity(4,4);
	TF2.setIdentity(4,4);

	// compute polynomial coefficients
	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26;
	l11 = L1_2[0];
	l12 = L1_2[1];
	l13 = L1_2[2];
	l14 = L1_2[3];
	l15 = L1_2[4];
	l16 = L1_2[5];
	l21 = L2_2[0];
	l22 = L2_2[1];
	l23 = L2_2[2];
	l24 = L2_2[3];
	l25 = L2_2[4];
	l26 = L2_2[5];
	floatPrec a, b, c;
	a = l13 * l26 - l14 * l21 - l12 * l25 - l15 * l22 - l11 * l24 + l16 * l23;
	b = 2 * l11 * l25 - 2 * l12 * l24 + 2 * l14 * l22 - 2 * l15 * l21;
	c = l11 * l24 + l12 * l25 + l13 * l26 + l14 * l21 + l15 * l22 + l16 * l23;

	// apply quadratic formula
	floatPrec s1, s2;
	s1 = (-b - sqrt(b * b - 4 * a * c)) / (2 * a);
	s2 = (-b + sqrt(b * b - 4 * a * c)) / (2 * a);

	if(!isnan(s1)){
		TF1 << (1 - s1 * s1) / (1 + s1 * s1), -2 * s1 / (1 + s1 * s1), 0, 0,
			2 * s1 / (1 + s1 * s1), (1 - s1 * s1) / (1 + s1 * s1), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF1 * TU);
		TF2 << (1 - s2 * s2) / (1 + s2 * s2), -2 * s2 / (1 + s2 * s2), 0, 0,
			2 * s2 / (1 + s2 * s2), (1 - s2 * s2) / (1 + s2 * s2), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF2 * TU);


	}
	return out;
}